

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O1

ON_SHA1_Hash * __thiscall ON_DimStyle::ContentHash(ON_DimStyle *this)

{
  ON_SHA1_Hash *this_00;
  bool bVar1;
  uint uVar2;
  ON_SHA1_Hash *sub_hash;
  ON_SHA1_Hash text_position_hash;
  ON_SHA1_Hash local_d0;
  ON_SHA1_Hash local_bc;
  ON_SHA1 local_a8;
  
  this_00 = &this->m_content_hash;
  bVar1 = ON_SHA1_Hash::IsEmptyContentHash(this_00);
  if (bVar1) {
    local_a8.m_state[2] = 0;
    local_a8.m_state[3] = 0;
    local_a8.m_state[4] = 0;
    local_a8.m_bit_count[0] = 0;
    local_a8.m_bit_count[1] = 0;
    local_a8.m_state[0] = 0;
    local_a8.m_state[1] = 0;
    local_a8.m_buffer[0x30] = '\0';
    local_a8.m_buffer[0x31] = '\0';
    local_a8.m_buffer[0x32] = '\0';
    local_a8.m_buffer[0x33] = '\0';
    local_a8.m_buffer[0x34] = '\0';
    local_a8.m_buffer[0x35] = '\0';
    local_a8.m_buffer[0x36] = '\0';
    local_a8.m_buffer[0x37] = '\0';
    local_a8.m_buffer[0x38] = '\0';
    local_a8.m_buffer[0x39] = '\0';
    local_a8.m_buffer[0x3a] = '\0';
    local_a8.m_buffer[0x3b] = '\0';
    local_a8.m_buffer[0x3c] = '\0';
    local_a8.m_buffer[0x3d] = '\0';
    local_a8.m_buffer[0x3e] = '\0';
    local_a8.m_buffer[0x3f] = '\0';
    local_a8.m_buffer[0x20] = '\0';
    local_a8.m_buffer[0x21] = '\0';
    local_a8.m_buffer[0x22] = '\0';
    local_a8.m_buffer[0x23] = '\0';
    local_a8.m_buffer[0x24] = '\0';
    local_a8.m_buffer[0x25] = '\0';
    local_a8.m_buffer[0x26] = '\0';
    local_a8.m_buffer[0x27] = '\0';
    local_a8.m_buffer[0x28] = '\0';
    local_a8.m_buffer[0x29] = '\0';
    local_a8.m_buffer[0x2a] = '\0';
    local_a8.m_buffer[0x2b] = '\0';
    local_a8.m_buffer[0x2c] = '\0';
    local_a8.m_buffer[0x2d] = '\0';
    local_a8.m_buffer[0x2e] = '\0';
    local_a8.m_buffer[0x2f] = '\0';
    local_a8.m_buffer[0x10] = '\0';
    local_a8.m_buffer[0x11] = '\0';
    local_a8.m_buffer[0x12] = '\0';
    local_a8.m_buffer[0x13] = '\0';
    local_a8.m_buffer[0x14] = '\0';
    local_a8.m_buffer[0x15] = '\0';
    local_a8.m_buffer[0x16] = '\0';
    local_a8.m_buffer[0x17] = '\0';
    local_a8.m_buffer[0x18] = '\0';
    local_a8.m_buffer[0x19] = '\0';
    local_a8.m_buffer[0x1a] = '\0';
    local_a8.m_buffer[0x1b] = '\0';
    local_a8.m_buffer[0x1c] = '\0';
    local_a8.m_buffer[0x1d] = '\0';
    local_a8.m_buffer[0x1e] = '\0';
    local_a8.m_buffer[0x1f] = '\0';
    local_a8.m_buffer[0] = '\0';
    local_a8.m_buffer[1] = '\0';
    local_a8.m_buffer[2] = '\0';
    local_a8.m_buffer[3] = '\0';
    local_a8.m_buffer[4] = '\0';
    local_a8.m_buffer[5] = '\0';
    local_a8.m_buffer[6] = '\0';
    local_a8.m_buffer[7] = '\0';
    local_a8.m_buffer[8] = '\0';
    local_a8.m_buffer[9] = '\0';
    local_a8.m_buffer[10] = '\0';
    local_a8.m_buffer[0xb] = '\0';
    local_a8.m_buffer[0xc] = '\0';
    local_a8.m_buffer[0xd] = '\0';
    local_a8.m_buffer[0xe] = '\0';
    local_a8.m_buffer[0xf] = '\0';
    local_a8.m_byte_count = 0;
    local_a8.m_status_bits = 0;
    local_a8.m_reserved = 0;
    ON_SHA1_Hash::ON_SHA1_Hash(&local_a8.m_sha1_hash);
    TextPositionPropertiesHash(&local_bc,this);
    ON_SHA1::AccumulateSubHash(&local_a8,&local_bc);
    ON_SHA1::AccumulateDouble(&local_a8,this->m_arrowsize);
    ON_SHA1::AccumulateDouble(&local_a8,this->m_leaderarrowsize);
    ON_SHA1::AccumulateDouble(&local_a8,this->m_centermark);
    ON_SHA1::AccumulateUnsigned32(&local_a8,(uint)this->m_centermark_style);
    ON_SHA1::AccumulateDouble(&local_a8,this->m_textgap);
    ON_SHA1::AccumulateBool(&local_a8,this->m_bSuppressExtension1);
    ON_SHA1::AccumulateBool(&local_a8,this->m_bSuppressExtension2);
    ON_SHA1::AccumulateUnsigned32(&local_a8,this->m_field_override_parent_count);
    ON_SHA1::AccumulateUnsigned32(&local_a8,this->m_field_override_parent_bits0);
    ON_SHA1::AccumulateUnsigned32(&local_a8,this->m_field_override_parent_bits1);
    ON_SHA1::AccumulateUnsigned32(&local_a8,this->m_field_override_parent_bits2);
    ON_SHA1::AccumulateUnsigned32(&local_a8,this->m_field_override_parent_bits3);
    ON_SHA1::AccumulateDouble(&local_a8,this->m_baseline_spacing);
    sub_hash = ON_TextMask::ContentHash(&this->m_text_mask);
    ON_SHA1::AccumulateSubHash(&local_a8,sub_hash);
    ON_ScaleValue::ContentHash(&local_d0,&this->m_scale_value);
    ON_SHA1::AccumulateSubHash(&local_a8,&local_d0);
    ON_SHA1::AccumulateInteger32(&local_a8,this->m_dimscale_source);
    ON_SHA1::AccumulateId(&local_a8,&this->m_source_dimstyle);
    ON_SHA1::AccumulateUnsigned8(&local_a8,this->m_ext_line_color_source);
    ON_SHA1::AccumulateUnsigned8(&local_a8,this->m_dim_line_color_source);
    ON_SHA1::AccumulateUnsigned8(&local_a8,this->m_arrow_color_source);
    ON_SHA1::AccumulateUnsigned8(&local_a8,this->m_text_color_source);
    uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_ext_line_color);
    ON_SHA1::AccumulateUnsigned32(&local_a8,uVar2);
    uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_dim_line_color);
    ON_SHA1::AccumulateUnsigned32(&local_a8,uVar2);
    uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_arrow_color);
    ON_SHA1::AccumulateUnsigned32(&local_a8,uVar2);
    uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_text_color);
    ON_SHA1::AccumulateUnsigned32(&local_a8,uVar2);
    ON_SHA1::AccumulateUnsigned8(&local_a8,this->m_ext_line_plot_color_source);
    ON_SHA1::AccumulateUnsigned8(&local_a8,this->m_dim_line_plot_color_source);
    ON_SHA1::AccumulateUnsigned8(&local_a8,this->m_arrow_plot_color_source);
    ON_SHA1::AccumulateUnsigned8(&local_a8,this->m_text_plot_color_source);
    uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_ext_line_plot_color);
    ON_SHA1::AccumulateUnsigned32(&local_a8,uVar2);
    uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_dim_line_plot_color);
    ON_SHA1::AccumulateUnsigned32(&local_a8,uVar2);
    uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_arrow_plot_color);
    ON_SHA1::AccumulateUnsigned32(&local_a8,uVar2);
    uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_text_plot_color);
    ON_SHA1::AccumulateUnsigned32(&local_a8,uVar2);
    ON_SHA1::AccumulateUnsigned8(&local_a8,this->m_ext_line_plot_weight_source);
    ON_SHA1::AccumulateUnsigned8(&local_a8,this->m_dim_line_plot_weight_source);
    ON_SHA1::AccumulateDouble(&local_a8,this->m_ext_line_plot_weight_mm);
    ON_SHA1::AccumulateDouble(&local_a8,this->m_dim_line_plot_weight_mm);
    ON_SHA1::AccumulateDouble(&local_a8,this->m_fixed_extension_len);
    ON_SHA1::AccumulateBool(&local_a8,this->m_fixed_extension_len_on);
    ON_SHA1::AccumulateBool(&local_a8,this->m_suppress_arrow1);
    ON_SHA1::AccumulateBool(&local_a8,this->m_suppress_arrow2);
    ON_SHA1::AccumulateUnsigned32(&local_a8,this->m_arrow_type_1);
    ON_SHA1::AccumulateUnsigned32(&local_a8,this->m_arrow_type_2);
    ON_SHA1::AccumulateUnsigned32(&local_a8,this->m_leader_arrow_type);
    ON_SHA1::AccumulateId(&local_a8,&this->m_arrow_block_id_1);
    ON_SHA1::AccumulateId(&local_a8,&this->m_arrow_block_id_2);
    ON_SHA1::AccumulateId(&local_a8,&this->m_leader_arrow_block_id);
    ON_SHA1::AccumulateUnsigned32(&local_a8,(uint)this->m_leader_content_angle_style);
    ON_SHA1::AccumulateUnsigned32(&local_a8,(uint)this->m_leader_curve_type);
    ON_SHA1::AccumulateDouble(&local_a8,this->m_leader_content_angle);
    ON_SHA1::AccumulateBool(&local_a8,this->m_leader_has_landing);
    ON_SHA1::AccumulateBool(&local_a8,this->m_draw_forward);
    ON_SHA1::AccumulateBool(&local_a8,this->m_signed_ordinate);
    ON_SHA1::AccumulateBool(&local_a8,this->m_bForceDimLine);
    ON_SHA1::AccumulateUnsigned32(&local_a8,(uint)this->m_ArrowFit);
    ON_SHA1::AccumulateUnsigned32(&local_a8,(uint)this->m_TextFit);
    ON_SHA1::AccumulateUnsigned32(&local_a8,this->m_decimal_separator);
    ON_SHA1::Hash(&local_d0,&local_a8);
    *(undefined4 *)((this->m_content_hash).m_digest + 0x10) = local_d0.m_digest._16_4_;
    *(undefined8 *)this_00->m_digest = local_d0.m_digest._0_8_;
    *(undefined8 *)((this->m_content_hash).m_digest + 8) = local_d0.m_digest._8_8_;
  }
  return this_00;
}

Assistant:

const class ON_SHA1_Hash& ON_DimStyle::ContentHash() const
{
  if (m_content_hash.IsEmptyContentHash())
  {
    ON_SHA1 sha1;

    ON_SHA1_Hash text_position_hash = TextPositionPropertiesHash();
    sha1.AccumulateSubHash(text_position_hash);

    sha1.AccumulateDouble(m_arrowsize);
    sha1.AccumulateDouble(m_leaderarrowsize);
    sha1.AccumulateDouble(m_centermark);
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_centermark_style));
    sha1.AccumulateDouble(m_textgap);

    sha1.AccumulateBool(m_bSuppressExtension1);
    sha1.AccumulateBool(m_bSuppressExtension2);
    sha1.AccumulateUnsigned32(m_field_override_parent_count);
    sha1.AccumulateUnsigned32(m_field_override_parent_bits0);
    sha1.AccumulateUnsigned32(m_field_override_parent_bits1);
    sha1.AccumulateUnsigned32(m_field_override_parent_bits2);
    sha1.AccumulateUnsigned32(m_field_override_parent_bits3);

    sha1.AccumulateDouble(m_baseline_spacing);
    sha1.AccumulateSubHash(m_text_mask.ContentHash());
    sha1.AccumulateSubHash(m_scale_value.ContentHash());
    sha1.AccumulateInteger32(m_dimscale_source);
    sha1.AccumulateId(m_source_dimstyle);
    sha1.AccumulateUnsigned8(m_ext_line_color_source);
    sha1.AccumulateUnsigned8(m_dim_line_color_source);
    sha1.AccumulateUnsigned8(m_arrow_color_source);
    sha1.AccumulateUnsigned8(m_text_color_source);
    sha1.AccumulateUnsigned32(m_ext_line_color);
    sha1.AccumulateUnsigned32(m_dim_line_color);
    sha1.AccumulateUnsigned32(m_arrow_color);
    sha1.AccumulateUnsigned32(m_text_color);
    sha1.AccumulateUnsigned8(m_ext_line_plot_color_source);
    sha1.AccumulateUnsigned8(m_dim_line_plot_color_source);
    sha1.AccumulateUnsigned8(m_arrow_plot_color_source);
    sha1.AccumulateUnsigned8(m_text_plot_color_source);
    sha1.AccumulateUnsigned32(m_ext_line_plot_color);
    sha1.AccumulateUnsigned32(m_dim_line_plot_color);
    sha1.AccumulateUnsigned32(m_arrow_plot_color);
    sha1.AccumulateUnsigned32(m_text_plot_color);
    sha1.AccumulateUnsigned8(m_ext_line_plot_weight_source);
    sha1.AccumulateUnsigned8(m_dim_line_plot_weight_source);
    sha1.AccumulateDouble(m_ext_line_plot_weight_mm);
    sha1.AccumulateDouble(m_dim_line_plot_weight_mm);
    sha1.AccumulateDouble(m_fixed_extension_len);
    sha1.AccumulateBool(m_fixed_extension_len_on);

    sha1.AccumulateBool(m_suppress_arrow1);
    sha1.AccumulateBool(m_suppress_arrow2);

    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_arrow_type_1));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_arrow_type_2));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_leader_arrow_type));
    sha1.AccumulateId(m_arrow_block_id_1);
    sha1.AccumulateId(m_arrow_block_id_2);
    sha1.AccumulateId(m_leader_arrow_block_id);

    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_leader_content_angle_style));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_leader_curve_type));
    sha1.AccumulateDouble(m_leader_content_angle);
    sha1.AccumulateBool(m_leader_has_landing);

    sha1.AccumulateBool(m_draw_forward);
    sha1.AccumulateBool(m_signed_ordinate);

    sha1.AccumulateBool(static_cast<unsigned int>(m_bForceDimLine));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_ArrowFit));
    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_TextFit));

    sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_decimal_separator));

    // Save hash in mutable m_content_hash
    m_content_hash = sha1.Hash();
  }

  return m_content_hash;
}